

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::Initialize
          (JsBuiltInEngineInterfaceExtensionObject *this)

{
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicType *type;
  DynamicObject *pDVar4;
  
  if (this->wasInitialized == false) {
    this_00 = (this->super_EngineExtensionObjectBase).scriptContext.ptr;
    this_01 = (this_00->super_ScriptContextBase).javascriptLibrary;
    pDVar4 = (((this_01->super_JavascriptLibraryBase).engineInterfaceObject.ptr)->
             commonNativeInterfaces).ptr;
    bVar2 = ScriptContext::IsJsBuiltInEnabled(this_00);
    if (bVar2) {
      if ((this_01->super_JavascriptLibraryBase).engineInterfaceObject.ptr ==
          (EngineInterfaceObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                    ,0x3c,"(library->GetEngineInterfaceObject() != nullptr)",
                                    "library->GetEngineInterfaceObject() != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      recycler = this_01->recycler;
      type = DynamicType::New((this->super_EngineExtensionObjectBase).scriptContext.ptr,
                              TypeIds_Object,&pDVar4->super_RecyclableObject,(JavascriptMethod)0x0,
                              (DynamicTypeHandler *)
                              DeferredTypeHandler<&Js::JsBuiltInEngineInterfaceExtensionObject::InitializeJsBuiltInNativeInterfaces,Js::DefaultDeferredTypeFilter,false,(unsigned_short)0,(unsigned_short)0>
                              ::defaultInstance,false,false);
      pDVar4 = DynamicObject::New(recycler,type);
      Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
                (&this->builtInNativeInterfaces,pDVar4);
      JavascriptLibrary::AddMember
                (this_01,&((this_01->super_JavascriptLibraryBase).engineInterfaceObject.ptr)->
                          super_DynamicObject,0x59,(this->builtInNativeInterfaces).ptr);
    }
    this->wasInitialized = true;
  }
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::Initialize()
    {
        if (wasInitialized)
        {
            return;
        }

        JavascriptLibrary* library = scriptContext->GetLibrary();
        DynamicObject* commonObject = library->GetEngineInterfaceObject()->GetCommonNativeInterfaces();
        if (scriptContext->IsJsBuiltInEnabled())
        {
            Assert(library->GetEngineInterfaceObject() != nullptr);
            builtInNativeInterfaces = DynamicObject::New(library->GetRecycler(),
                DynamicType::New(scriptContext, TypeIds_Object, commonObject, nullptr,
                    DeferredTypeHandler<InitializeJsBuiltInNativeInterfaces>::GetDefaultInstance()));
            library->AddMember(library->GetEngineInterfaceObject(), Js::PropertyIds::JsBuiltIn, builtInNativeInterfaces);
        }

        wasInitialized = true;
    }